

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

FILE * pugi::impl::anon_unknown_0::open_file_wide(wchar_t *path,wchar_t *mode)

{
  wchar_t wVar1;
  undefined8 in_RAX;
  long lVar2;
  byte *__filename;
  byte *result;
  FILE *pFVar3;
  byte *pbVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  char mode_ascii [4];
  undefined8 uStack_38;
  
  if (path == (wchar_t *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                  ,0x1399,
                  "char *pugi::impl::(anonymous namespace)::convert_path_heap(const wchar_t *)");
  }
  lVar5 = -4;
  do {
    lVar7 = lVar5 + 4;
    lVar5 = lVar5 + 4;
  } while (*(int *)((long)path + lVar7) != 0);
  if (lVar5 == 0) {
    lVar7 = 0;
  }
  else {
    lVar2 = 0;
    lVar7 = 0;
    do {
      wVar1 = path[lVar2];
      if ((uint)wVar1 < 0x10000) {
        lVar6 = 3 - (ulong)((uint)wVar1 < 0x800);
        if ((uint)wVar1 < 0x80) {
          lVar6 = 1;
        }
        lVar7 = lVar7 + lVar6;
      }
      else {
        lVar7 = lVar7 + 4;
      }
      lVar2 = lVar2 + 1;
    } while (lVar5 >> 2 != lVar2);
  }
  uStack_38 = in_RAX;
  __filename = (byte *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>
                                 ::allocate)(lVar7 + 1);
  if (__filename == (byte *)0x0) {
    pFVar3 = (FILE *)0x0;
  }
  else {
    if (lVar5 == 0) {
      pbVar4 = __filename;
      if (lVar7 != 0) goto LAB_00133fb0;
    }
    else {
      lVar2 = 0;
      result = __filename;
      do {
        wVar1 = path[lVar2];
        if ((uint)wVar1 < 0x10000) {
          result = utf8_writer::low(result,wVar1);
        }
        else {
          *result = (byte)((uint)wVar1 >> 0x12) | 0xf0;
          result[1] = (byte)((uint)wVar1 >> 0xc) & 0x3f | 0x80;
          result[2] = (byte)((uint)wVar1 >> 6) & 0x3f | 0x80;
          result[3] = (byte)wVar1 & 0x3f | 0x80;
          result = result + 4;
        }
        lVar2 = lVar2 + 1;
      } while (lVar5 >> 2 != lVar2);
      pbVar4 = __filename + lVar7;
      if (__filename + lVar7 != result) {
LAB_00133fb0:
        __assert_fail("begin + size == end",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                      ,0x905,
                      "void pugi::impl::(anonymous namespace)::as_utf8_end(char *, size_t, const wchar_t *, size_t)"
                     );
      }
    }
    *pbVar4 = 0;
    uStack_38 = (ulong)(uint)uStack_38;
    wVar1 = *mode;
    if (wVar1 != L'\0') {
      lVar5 = 0;
      do {
        *(char *)((long)&uStack_38 + lVar5 + 4) = (char)wVar1;
        wVar1 = mode[lVar5 + 1];
        lVar5 = lVar5 + 1;
      } while (wVar1 != L'\0');
    }
    pFVar3 = fopen((char *)__filename,(char *)((long)&uStack_38 + 4));
    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
              (__filename);
  }
  return (FILE *)pFVar3;
}

Assistant:

PUGI__FN char* convert_path_heap(const wchar_t* str)
	{
		assert(str);

		// first pass: get length in utf8 characters
		size_t length = strlength_wide(str);
		size_t size = as_utf8_begin(str, length);

		// allocate resulting string
		char* result = static_cast<char*>(xml_memory::allocate(size + 1));
		if (!result) return 0;

		// second pass: convert to utf8
		as_utf8_end(result, size, str, length);

		// zero-terminate
		result[size] = 0;

		return result;
	}